

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga.c
# Opt level: O3

void xc_mgga_exc_vxc_fxc(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,
                        double *tau,double *zk,double *vrho,double *vsigma,double *vlapl,
                        double *vtau,double *v2rho2,double *v2rhosigma,double *v2rholapl,
                        double *v2rhotau,double *v2sigma2,double *v2sigmalapl,double *v2sigmatau,
                        double *v2lapl2,double *v2lapltau,double *v2tau2)

{
  xc_mgga_out_params local_260;
  
  memset(&local_260.v3rho3,0,0x1b8);
  local_260.zk = zk;
  local_260.vrho = vrho;
  local_260.vsigma = vsigma;
  local_260.vlapl = vlapl;
  local_260.vtau = vtau;
  local_260.v2rho2 = v2rho2;
  local_260.v2rhosigma = v2rhosigma;
  local_260.v2rholapl = v2rholapl;
  local_260.v2rhotau = v2rhotau;
  local_260.v2sigma2 = v2sigma2;
  local_260.v2sigmalapl = v2sigmalapl;
  local_260.v2sigmatau = v2sigmatau;
  local_260.v2lapl2 = v2lapl2;
  local_260.v2lapltau = v2lapltau;
  local_260.v2tau2 = v2tau2;
  xc_mgga_new(p,2,np,rho,sigma,lapl,tau,&local_260);
  return;
}

Assistant:

void xc_mgga_exc_vxc_fxc(const xc_func_type *p, size_t np,
                         const double *rho, const double *sigma, const double *lapl, const double *tau,
                         double *zk, double *vrho, double *vsigma, double *vlapl, double *vtau,
                         double *v2rho2, double *v2rhosigma, double *v2rholapl, double *v2rhotau,
                         double *v2sigma2, double *v2sigmalapl, double *v2sigmatau, double *v2lapl2,
                         double *v2lapltau, double *v2tau2)
{
  xc_mgga_out_params out;
  libxc_memset(&out, 0, sizeof(xc_mgga_out_params));
  SET_ORDER_0;
  SET_ORDER_1;
  SET_ORDER_2;

  xc_mgga_new(p, 2, np, rho, sigma, lapl, tau, &out);
}